

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * flatbuffers::ConCatPathFileName
                   (string *__return_storage_ptr__,string *path,string *filename)

{
  long lVar1;
  char *pcVar2;
  char *filepath_last_character;
  string *filename_local;
  string *path_local;
  string *filepath;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    pcVar2 = (char *)std::__cxx11::string::back();
    if (*pcVar2 == '\\') {
      *pcVar2 = '/';
    }
    else if (*pcVar2 != '/') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
    }
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)filename);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  if ((*pcVar2 == '.') &&
     (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__),
     *pcVar2 == '/')) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConCatPathFileName(const std::string &path,
                               const std::string &filename) {
  std::string filepath = path;
  if (filepath.length()) {
    char &filepath_last_character = filepath.back();
    if (filepath_last_character == kPathSeparatorWindows) {
      filepath_last_character = kPathSeparator;
    } else if (filepath_last_character != kPathSeparator) {
      filepath += kPathSeparator;
    }
  }
  filepath += filename;
  // Ignore './' at the start of filepath.
  if (filepath[0] == '.' && filepath[1] == kPathSeparator) {
    filepath.erase(0, 2);
  }
  return filepath;
}